

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O1

int __thiscall
TPZSkylMatrix<std::complex<long_double>_>::PutVal
          (TPZSkylMatrix<std::complex<long_double>_> *this,int64_t r,int64_t c,
          complex<long_double> *value)

{
  undefined8 *puVar1;
  complex<long_double> **ppcVar2;
  complex<long_double> *pcVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  long lVar7;
  longdouble in_ST0;
  
  lVar7 = r - c;
  if (lVar7 == 0 || r < c) {
    lVar7 = -(r - c);
    r = c;
  }
  ppcVar2 = (this->fElem).fStore;
  if ((lVar7 < (long)ppcVar2[r + 1] - (long)ppcVar2[r] >> 5) ||
     (cabsl(), ABS(in_ST0) < (longdouble)1e-16)) {
    ppcVar2 = (this->fElem).fStore;
    if ((long)ppcVar2[r + 1] - (long)ppcVar2[r] >> 5 <= lVar7) {
      return 1;
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"TPZSkylMatrix::PutVal Size",0x1a);
    std::ostream::_M_insert<long>((long)&std::cout);
    std::ostream::flush();
    TPZMatrix<std::complex<long_double>_>::Error
              ("virtual int TPZSkylMatrix<std::complex<long double>>::PutVal(const int64_t, const int64_t, const TVar &) [TVar = std::complex<long double>]"
               ,"Index out of range");
  }
  pcVar3 = (this->fElem).fStore[r];
  uVar4 = *(undefined8 *)value->_M_value;
  uVar5 = *(undefined8 *)(value->_M_value + 8);
  uVar6 = *(undefined8 *)(value->_M_value + 0x18);
  puVar1 = (undefined8 *)(pcVar3[lVar7]._M_value + 0x10);
  *puVar1 = *(undefined8 *)(value->_M_value + 0x10);
  puVar1[1] = uVar6;
  pcVar3 = pcVar3 + lVar7;
  *(undefined8 *)pcVar3->_M_value = uVar4;
  *(undefined8 *)(pcVar3->_M_value + 8) = uVar5;
  (this->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fDecomposed = '\0';
  return 1;
}

Assistant:

int
TPZSkylMatrix<TVar>::PutVal(const int64_t r,const int64_t c,const TVar & value )
{
	// inicializando row e col para trabalhar com a triangular superior
	int64_t row(r),col(c);
	if ( row > col )
		this->Swap( &row, &col );
	
	// Indice do vetor coluna.
	int64_t index = col - row;
	// Se precisar redimensionar o vetor.
	//EBORIN: Do we really need to check this?
	if ( index >= Size(col) && !IsZero(value)) {
		cout << "TPZSkylMatrix::PutVal Size" << Size(col);
		cout.flush();
		TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__,"Index out of range");
	} else if(index >= Size(col)) return 1;
	fElem[col][index] = value;
	//  delete[]newVet;
	this->fDecomposed = 0;
	return( 1 );
}